

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall
chrono::ChBody::ContactForceLoadQ
          (ChBody *this,ChVector<double> *F,ChVector<double> *point,ChState *state_x,
          ChVectorDynamic<> *Q,int offset)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_100;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_f0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  ChVector<double> force_loc;
  ChVector<double> point_loc;
  ChCoordsys<double> csys;
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_f0,
             &state_x->super_ChVectorDynamic<double>,0,7);
  ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&csys,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_f0,(type *)0x0);
  ChCoordsys<double>::TransformPointParentToLocal(&point_loc,&csys,point);
  ChQuaternion<double>::RotateBack(&csys.rot,F);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = point_loc.m_data[0];
  auVar6._8_8_ = point_loc.m_data[2];
  auVar6._0_8_ = point_loc.m_data[2];
  auVar2._8_8_ = point_loc.m_data[2];
  auVar2._0_8_ = point_loc.m_data[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = force_loc.m_data[0];
  auVar8._8_8_ = force_loc.m_data[2];
  auVar8._0_8_ = force_loc.m_data[2];
  auVar1._8_8_ = force_loc.m_data[2];
  auVar1._0_8_ = force_loc.m_data[1];
  auVar4 = vunpcklpd_avx(auVar6,auVar5);
  auVar3 = vunpcklpd_avx(auVar8,auVar3);
  auVar7._0_8_ = force_loc.m_data[1] * auVar4._0_8_;
  auVar7._8_8_ = force_loc.m_data[2] * auVar4._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = force_loc.m_data[0] * point_loc.m_data[1];
  auVar4 = vfmsub231sd_fma(auVar4,auVar5,auVar1);
  local_b8 = vfmsub213pd_fma(auVar3,auVar2,auVar7);
  local_a8 = auVar4._0_8_;
  local_100.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = F->m_data;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_f0,Q,(long)offset,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_f0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_100)
  ;
  local_100.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)local_b8;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_f0,Q,(long)(offset + 3),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_f0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
  return;
}

Assistant:

void ChBody::ContactForceLoadQ(const ChVector<>& F,
                               const ChVector<>& point,
                               const ChState& state_x,
                               ChVectorDynamic<>& Q,
                               int offset) {
    ChCoordsys<> csys(state_x.segment(0, 7));
    ChVector<> point_loc = csys.TransformPointParentToLocal(point);
    ChVector<> force_loc = csys.TransformDirectionParentToLocal(F);
    ChVector<> torque_loc = Vcross(point_loc, force_loc);
    Q.segment(offset + 0, 3) = F.eigen();
    Q.segment(offset + 3, 3) = torque_loc.eigen();
}